

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O3

Cnf_Dat_t * Cnf_DataReadFromFile(char *pFileName)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  char *__s;
  char *pcVar4;
  Vec_Int_t *p;
  int *piVar5;
  Vec_Int_t *p_00;
  Cnf_Dat_t *pCVar6;
  int **ppiVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pCVar6 = (Cnf_Dat_t *)0x0;
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
  }
  else {
    __s = (char *)malloc(1000000);
    pcVar4 = fgets(__s,1000000,__stream);
    if (pcVar4 != (char *)0x0) {
      uVar3 = 0xffffffff;
      uVar9 = 0;
      uVar10 = 0xffffffff;
      p_00 = (Vec_Int_t *)0x0;
      p = (Vec_Int_t *)0x0;
LAB_00509e75:
      do {
        uVar9 = uVar9 + 1;
        if (*__s != 'c') {
          if (*__s == 'p') goto LAB_00509f28;
          pcVar4 = strtok(__s," \t\r\n");
          if (pcVar4 != (char *)0x0) {
            Vec_IntPush(p,p_00->nSize);
            while (uVar1 = atoi(pcVar4), uVar1 != 0) {
              if ((int)uVar1 < 1) {
                uVar1 = ~uVar1 * 2 + 1;
              }
              else {
                uVar1 = uVar1 * 2 - 2;
              }
              if (SBORROW4(uVar1,(int)uVar10 * 2) == (int)(uVar1 + (int)uVar10 * -2) < 0) {
                printf("Literal %d is out-of-bound for %d variables.\n",(ulong)uVar1,uVar10);
                goto LAB_0050a132;
              }
              Vec_IntPush(p_00,uVar1);
              pcVar4 = strtok((char *)0x0," \t\r\n");
              if (pcVar4 == (char *)0x0) {
                printf("There is no zero-terminator in line %d.\n",(ulong)uVar9);
                goto LAB_0050a132;
              }
            }
          }
        }
        pcVar4 = fgets(__s,1000000,__stream);
        if (pcVar4 == (char *)0x0) goto LAB_0050a067;
      } while( true );
    }
    uVar10 = 0xffffffff;
    p = (Vec_Int_t *)0x0;
    p_00 = (Vec_Int_t *)0x0;
    uVar3 = 0xffffffff;
LAB_0050a067:
    if (p->nSize != uVar3) {
      printf("Warning! The number of clauses (%d) is different from declaration (%d).\n",
             (ulong)(uint)p->nSize,(ulong)uVar3);
    }
    Vec_IntPush(p,p_00->nSize);
    pCVar6 = (Cnf_Dat_t *)calloc(1,0x48);
    pCVar6->nVars = (int)uVar10;
    pCVar6->nClauses = uVar3;
    pCVar6->nLiterals = p_00->nSize;
    ppiVar7 = (int **)malloc((long)p->nSize << 3);
    pCVar6->pClauses = ppiVar7;
    piVar5 = p_00->pArray;
    p_00->nCap = 0;
    p_00->nSize = 0;
    p_00->pArray = (int *)0x0;
    *ppiVar7 = piVar5;
    iVar2 = p->nSize;
    if (0 < (long)iVar2) {
      lVar8 = 0;
      do {
        ppiVar7[lVar8] = *ppiVar7 + p->pArray[lVar8];
        lVar8 = lVar8 + 1;
      } while (iVar2 != lVar8);
    }
    fclose(__stream);
LAB_0050a144:
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
    }
    free(p);
LAB_0050a15a:
    if (p_00 != (Vec_Int_t *)0x0) {
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
      }
      free(p_00);
    }
    if (__s != (char *)0x0) {
      free(__s);
    }
  }
  return pCVar6;
LAB_00509f28:
  pcVar4 = strtok(__s + 1," \t");
  iVar2 = strcmp(pcVar4,"cnf");
  if (iVar2 == 0) {
    pcVar4 = strtok((char *)0x0," \t");
    uVar1 = atoi(pcVar4);
    uVar10 = (ulong)uVar1;
    pcVar4 = strtok((char *)0x0," \t");
    uVar3 = atoi(pcVar4);
    if ((0 < (int)uVar1) && (0 < (int)uVar3)) {
      p = (Vec_Int_t *)malloc(0x10);
      uVar1 = uVar3 + 1;
      if (uVar3 < 0xf) {
        uVar1 = 0x10;
      }
      p->nSize = 0;
      p->nCap = uVar1;
      piVar5 = (int *)malloc((ulong)uVar1 << 2);
      p->pArray = piVar5;
      p_00 = (Vec_Int_t *)malloc(0x10);
      uVar1 = uVar3 * 8;
      if (uVar3 * 8 - 1 < 0xf) {
        uVar1 = 0x10;
      }
      p_00->nSize = 0;
      p_00->nCap = uVar1;
      if (uVar1 == 0) {
        piVar5 = (int *)0x0;
      }
      else {
        piVar5 = (int *)malloc((ulong)uVar1 << 2);
      }
      p_00->pArray = piVar5;
      pcVar4 = fgets(__s,1000000,__stream);
      if (pcVar4 == (char *)0x0) goto LAB_0050a067;
      goto LAB_00509e75;
    }
    pcVar4 = "Incorrect parameters.";
  }
  else {
    pcVar4 = "Incorrect input file.";
  }
  puts(pcVar4);
LAB_0050a132:
  fclose(__stream);
  pCVar6 = (Cnf_Dat_t *)0x0;
  if (p == (Vec_Int_t *)0x0) goto LAB_0050a15a;
  goto LAB_0050a144;
}

Assistant:

Cnf_Dat_t * Cnf_DataReadFromFile( char * pFileName )
{
    int MaxLine = 1000000;
    int Var, Lit, nVars = -1, nClas = -1, i, Entry, iLine = 0;
    Cnf_Dat_t * pCnf = NULL;
    Vec_Int_t * vClas = NULL;
    Vec_Int_t * vLits = NULL;
    char * pBuffer, * pToken;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return NULL;
    }
    pBuffer = ABC_ALLOC( char, MaxLine );
    while ( fgets(pBuffer, MaxLine, pFile) != NULL )
    {
        iLine++;
        if ( pBuffer[0] == 'c' )
            continue;
        if ( pBuffer[0] == 'p' )
        {
            pToken = strtok( pBuffer+1, " \t" );
            if ( strcmp(pToken, "cnf") )
            {
                printf( "Incorrect input file.\n" );
                goto finish;
            }
            pToken = strtok( NULL, " \t" );
            nVars = atoi( pToken );
            pToken = strtok( NULL, " \t" );
            nClas = atoi( pToken );
            if ( nVars <= 0 || nClas <= 0 )
            {
                printf( "Incorrect parameters.\n" );
                goto finish;
            }
            // temp storage
            vClas = Vec_IntAlloc( nClas+1 );
            vLits = Vec_IntAlloc( nClas*8 );
            continue;
        }
        pToken = strtok( pBuffer, " \t\r\n" );
        if ( pToken == NULL )
            continue;
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        while ( pToken )
        {
            Var = atoi( pToken );
            if ( Var == 0 )
                break;
            Lit = (Var > 0) ? Abc_Var2Lit(Var-1, 0) : Abc_Var2Lit(-Var-1, 1);
            if ( Lit >= 2*nVars )
            {
                printf( "Literal %d is out-of-bound for %d variables.\n", Lit, nVars );
                goto finish;
            }
            Vec_IntPush( vLits, Lit );
            pToken = strtok( NULL, " \t\r\n" );
        }
        if ( Var != 0 )
        {
            printf( "There is no zero-terminator in line %d.\n", iLine );
            goto finish;
        }
    }
    // finalize
    if ( Vec_IntSize(vClas) != nClas )
        printf( "Warning! The number of clauses (%d) is different from declaration (%d).\n", Vec_IntSize(vClas), nClas );
    Vec_IntPush( vClas, Vec_IntSize(vLits) );
    // create
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->nVars     = nVars;
    pCnf->nClauses  = nClas;
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->pClauses  = ABC_ALLOC( int *, Vec_IntSize(vClas) );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
finish:
    fclose( pFile );
    Vec_IntFreeP( &vClas );
    Vec_IntFreeP( &vLits );
    ABC_FREE( pBuffer );
    return pCnf;
}